

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlSchemaPtrWrap(xmlSchemaPtr ctxt)

{
  PyObject *ret;
  xmlSchemaPtr ctxt_local;
  
  if (ctxt == (xmlSchemaPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    ctxt_local = (xmlSchemaPtr)&_Py_NoneStruct;
  }
  else {
    ctxt_local = (xmlSchemaPtr)PyCapsule_New(ctxt,"xmlSchemaPtr",0);
  }
  return (PyObject *)ctxt_local;
}

Assistant:

PyObject *
libxml_xmlSchemaPtrWrap(xmlSchemaPtr ctxt)
{
	PyObject *ret;

	if (ctxt == NULL) {
		Py_INCREF(Py_None);
		return (Py_None);
	}
	ret =
		PyCapsule_New((void *) ctxt,
									 (char *) "xmlSchemaPtr", NULL);
	return (ret);
}